

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  uint uVar1;
  SectionTracker *pSVar2;
  pointer pIVar3;
  undefined8 *in_RDX;
  long in_RSI;
  SourceLineInfo *in_RDI;
  bool bVar4;
  TrackerContext *unaff_retaddr;
  ITracker *sectionTracker;
  value_type *in_stack_ffffffffffffff68;
  NameAndLocation local_58;
  SectionTracker *local_28;
  undefined8 *local_20;
  long local_18;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  TestCaseTracking::NameAndLocation::NameAndLocation(&local_58,(string *)(in_RDI + 0x20),in_RDI);
  pSVar2 = TestCaseTracking::SectionTracker::acquire
                     (unaff_retaddr,
                      (NameAndLocation *)
                      CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  TestCaseTracking::NameAndLocation::~NameAndLocation((NameAndLocation *)0x269202);
  local_28 = pSVar2;
  uVar1 = (*(pSVar2->super_TrackerBase).super_ITracker._vptr_ITracker[4])();
  bVar4 = (uVar1 & 1) != 0;
  if (bVar4) {
    clara::std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::push_back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                 *)in_RDI,in_stack_ffffffffffffff68);
    in_RDI[0x1a].line = *(size_t *)(local_18 + 0x40);
    in_RDI[0x1b].file = *(char **)(local_18 + 0x48);
    pIVar3 = clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                           *)0x269294);
    (*pIVar3->_vptr_IStreamingReporter[8])(pIVar3,local_18);
    *local_20 = in_RDI[0x10].file;
    local_20[1] = in_RDI[0x10].line;
    local_20[2] = in_RDI[0x11].file;
  }
  return bVar4;
}

Assistant:

bool RunContext::sectionStarted(SectionInfo const & sectionInfo, Counts & assertions) {
        ITracker& sectionTracker = SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(sectionInfo.name, sectionInfo.lineInfo));
        if (!sectionTracker.isOpen())
            return false;
        m_activeSections.push_back(&sectionTracker);

        m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

        m_reporter->sectionStarting(sectionInfo);

        assertions = m_totals.assertions;

        return true;
    }